

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

int Tas_StorePattern(Vec_Ptr_t *vSimInfo,Vec_Ptr_t *vPres,Vec_Int_t *vCex)

{
  int iVar1;
  int iVar2;
  int iBit;
  uint uVar3;
  
  uVar3 = 1;
  iVar1 = Tas_StorePatternTry(vSimInfo,vPres,1,vCex->pArray,vCex->nSize);
  if (iVar1 == 0) {
    iVar1 = 2;
    do {
      iBit = iVar1;
      if (iBit == 0x20) break;
      iVar2 = Tas_StorePatternTry(vSimInfo,vPres,iBit,vCex->pArray,vCex->nSize);
      iVar1 = iBit + 1;
    } while (iVar2 == 0);
    uVar3 = (uint)(iBit - 1U < 0x1f);
  }
  return uVar3;
}

Assistant:

int Tas_StorePattern( Vec_Ptr_t * vSimInfo, Vec_Ptr_t * vPres, Vec_Int_t * vCex )
{
    int k;
    for ( k = 1; k < 32; k++ )
        if ( Tas_StorePatternTry( vSimInfo, vPres, k, (int *)Vec_IntArray(vCex), Vec_IntSize(vCex) ) )
            break;
    return (int)(k < 32);
}